

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

char * Cudd_zddCoverPathToString(DdManager *zdd,int *path,char *str)

{
  ulong uVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  
  if ((zdd->sizeZ & 1U) == 0) {
    uVar4 = zdd->sizeZ >> 1;
    if (str == (char *)0x0) {
      str = (char *)malloc((long)(int)(uVar4 + 1));
      if (str == (char *)0x0) goto LAB_0091e1e8;
    }
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        uVar2 = path[uVar1 * 2] << 2 | path[uVar1 * 2 + 1];
        cVar3 = '?';
        if (uVar2 < 0xb) {
          cVar3 = (&DAT_00abddeb)[uVar2];
        }
        str[uVar1] = cVar3;
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    str[(int)uVar4] = '\0';
  }
  else {
LAB_0091e1e8:
    str = (char *)0x0;
  }
  return str;
}

Assistant:

char *
Cudd_zddCoverPathToString(
  DdManager *zdd                /* DD manager */,
  int *path                     /* path of ZDD representing a cover */,
  char *str                     /* pointer to string to use if != NULL */
  )
{
    int nvars = zdd->sizeZ;
    int i;
    char *res;

    if (nvars & 1) return(NULL);
    nvars >>= 1;
    if (str == NULL) {
        res = ABC_ALLOC(char, nvars+1);
        if (res == NULL) return(NULL);
    } else {
        res = str;
    }
    for (i = 0; i < nvars; i++) {
        int v = (path[2*i] << 2) | path[2*i+1];
        switch (v) {
        case 0:
        case 2:
        case 8:
        case 10:
            res[i] = '-';
            break;
        case 1:
        case 9:
            res[i] = '0';
            break;
        case 4:
        case 6:
            res[i] = '1';
            break;
        default:
            res[i] = '?';
        }
    }
    res[nvars] = 0;

    return(res);

}